

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8DifferentPoliciesTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section8DifferentPoliciesTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.8.9";
  local_88.should_validate = false;
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<6ul,5ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3fc32f_006dc820,(char *(*) [6])&PTR_anon_var_dwarf_3fc361_006dc850,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8DifferentPoliciesTest9) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate",         "PoliciesP123CACert",
      "PoliciesP123subCAP12Cert",           "PoliciesP123subsubCAP12P2Cert",
      "PoliciesP123subsubsubCAP12P2P1Cert", "DifferentPoliciesTest9EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "PoliciesP123CACRL", "PoliciesP123subCAP12CRL",
      "PoliciesP123subsubCAP2P2CRL", "PoliciesP123subsubsubCAP12P2P1CRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.9";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}